

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_SUB_rri(DisasContext_conflict1 *s,arg_s_rri_rot *a)

{
  _Bool _Var1;
  StoreRegKind kind;
  code *gen;
  
  kind = get_storage3(s,a->rd,a->rn,&a->s);
  gen = gen_sub_CC;
  if (a->s == 0) {
    gen = tcg_gen_sub_i32;
  }
  _Var1 = op_s_rri_rot(s,a,gen,0,kind);
  return _Var1;
}

Assistant:

static StoreRegKind get_storage2(DisasContext *s, int rd, int *as)
{
    StoreRegKind ret = STREG_NORMAL;
    if (rd == 15 && *as) {
        /*
         * See ALUExceptionReturn:
         * In User mode, UNPREDICTABLE; we choose UNDEF.
         * In Hyp mode, UNDEFINED.
         */
        if (IS_USER(s) || s->current_el == 2) {
            unallocated_encoding(s);
            return true;
        }
        /* There is no writeback of nzcv to PSTATE.  */
        *as = 0;
        ret = STREG_EXC_RET;
    } else if (rd == 13) {
        ret = STREG_SP_CHECK;
    }

    return ret;
}